

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O2

void __thiscall QPDF::createFromJSON(QPDF *this,shared_ptr<InputSource> *is)

{
  int iVar1;
  undefined4 extraout_var;
  __shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  iVar1 = (*((is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_InputSource[3])();
  processMemoryFile(this,*(char **)CONCAT44(extraout_var,iVar1),
                    "%PDF-1.3\nxref\n0 1\n0000000000 65535 f \ntrailer << /Size 1 >>\nstartxref\n9\n%%EOF\n"
                    ,0x4e,(char *)0x0);
  std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,&is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>);
  importJSON(this,(shared_ptr<InputSource> *)&_Stack_28,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return;
}

Assistant:

void
QPDF::createFromJSON(std::shared_ptr<InputSource> is)
{
    processMemoryFile(is->getName().c_str(), JSON_PDF, strlen(JSON_PDF));
    importJSON(is, true);
}